

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzham_symbol_codec.cpp
# Opt level: O2

bool __thiscall
lzham::symbol_codec::encode(symbol_codec *this,uint bit,adaptive_bit_model *model,bool update_model)

{
  uint *puVar1;
  ushort uVar2;
  bool bVar3;
  uint uVar4;
  uint uVar5;
  output_symbol sym;
  output_symbol local_28;
  
  this->m_arith_total_bits = this->m_arith_total_bits + 1;
  local_28.m_num_bits = -1;
  local_28.m_bits = bit;
  local_28.m_arith_prob0 = model->m_bit_0_prob;
  bVar3 = vector<lzham::symbol_codec::output_symbol>::try_push_back(&this->m_output_syms,&local_28);
  if (bVar3) {
    uVar2 = model->m_bit_0_prob;
    uVar5 = this->m_arith_length;
    uVar4 = (uVar5 >> 0xb) * (uint)uVar2;
    if (bit == 0) {
      if (update_model) {
        model->m_bit_0_prob = (short)(0x800 - uVar2 >> 5) + uVar2;
      }
      this->m_arith_length = uVar4;
    }
    else {
      if (update_model) {
        model->m_bit_0_prob = uVar2 - (uVar2 >> 5);
      }
      uVar5 = uVar5 - uVar4;
      puVar1 = &this->m_arith_base;
      bVar3 = CARRY4(*puVar1,uVar4);
      *puVar1 = *puVar1 + uVar4;
      this->m_arith_length = uVar5;
      uVar4 = uVar5;
      if (bVar3) {
        arith_propagate_carry(this);
        uVar4 = this->m_arith_length;
      }
    }
    if (uVar4 < 0x1000000) {
      bVar3 = arith_renorm_enc_interval(this);
      if (!bVar3) goto LAB_0011f05d;
    }
    bVar3 = true;
  }
  else {
LAB_0011f05d:
    bVar3 = false;
  }
  return bVar3;
}

Assistant:

bool symbol_codec::encode(uint bit, adaptive_bit_model& model, bool update_model)
   {
      LZHAM_ASSERT(m_mode == cEncoding);

      m_arith_total_bits++;

      output_symbol sym;
      sym.m_bits = bit;
      sym.m_num_bits = -1;
      sym.m_arith_prob0 = model.m_bit_0_prob;
      if (!m_output_syms.try_push_back(sym))
         return false;

      uint x = model.m_bit_0_prob * (m_arith_length >> cSymbolCodecArithProbBits);

      if (!bit)
      {
         if (update_model)
            model.m_bit_0_prob += ((cSymbolCodecArithProbScale - model.m_bit_0_prob) >> cSymbolCodecArithProbMoveBits);

         m_arith_length = x;
      }
      else
      {
         if (update_model)
            model.m_bit_0_prob -= (model.m_bit_0_prob >> cSymbolCodecArithProbMoveBits);

         uint orig_base = m_arith_base;
         m_arith_base   += x;
         m_arith_length -= x;
         if (orig_base > m_arith_base)
            arith_propagate_carry();
      }

      if (m_arith_length < cSymbolCodecArithMinLen)
      {
         if (!arith_renorm_enc_interval())
            return false;
      }

      return true;
   }